

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O2

Translator * __thiscall
helics::ConnectorFederateManager::getTranslator(ConnectorFederateManager *this,int index)

{
  undefined1 *puVar1;
  handle sharedTran;
  handle local_28;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_28,&this->translators);
  puVar1 = invalidTranNC;
  if ((-1 < index) && (index < (int)((local_28.data)->dataStorage).csize)) {
    puVar1 = (undefined1 *)
             (((local_28.data)->dataStorage).dataptr[(uint)index >> 5] + (index & 0x1f));
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_28.m_handle_lock);
  return (Translator *)puVar1;
}

Assistant:

Translator& ConnectorFederateManager::getTranslator(int index)
{
    auto sharedTran = translators.lock();
    if (isValidIndex(index, *sharedTran)) {
        return (*sharedTran)[index];
    }
    return invalidTranNC;
}